

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O0

void __thiscall
pbrt::PixelSensor::PixelSensor
          (PixelSensor *this,SpectrumHandle *r_bar,SpectrumHandle *g_bar,SpectrumHandle *b_bar,
          RGBColorSpace *outputColorSpace,Float wbTemp,Float imagingRatio,Allocator alloc)

{
  bool bVar1;
  SquareMatrix<3> *__src;
  DenselySampledSpectrum *in_RCX;
  undefined8 in_RDX;
  Allocator in_RSI;
  SquareMatrix<3> *in_RDI;
  Float in_XMM1_Da;
  optional<pbrt::SquareMatrix<3>_> m;
  DenselySampledSpectrum sensorIlluminant;
  SpectrumHandle *in_stack_000002d8;
  SpectrumHandle *in_stack_000002e0;
  PixelSensor *in_stack_000002e8;
  DenselySampledSpectrum *in_stack_fffffffffffffec8;
  SpectrumHandle *in_stack_fffffffffffffed0;
  SpectrumHandle *in_stack_fffffffffffffee0;
  Float (*s) [3];
  char *fmt;
  optional local_d0 [144];
  char local_40 [8];
  Float local_38;
  Float temperature;
  Allocator alloc_00;
  
  temperature = (Float)((ulong)in_RDX >> 0x20);
  local_38 = in_XMM1_Da;
  alloc_00.memoryResource = in_RSI.memoryResource;
  SquareMatrix<3>::SquareMatrix(in_RDI);
  fmt = local_40;
  SpectrumHandle::SpectrumHandle
            (in_stack_fffffffffffffed0,(SpectrumHandle *)in_stack_fffffffffffffec8);
  DenselySampledSpectrum::DenselySampledSpectrum(in_RCX,in_stack_fffffffffffffee0,in_RSI);
  SpectrumHandle::SpectrumHandle
            (in_stack_fffffffffffffed0,(SpectrumHandle *)in_stack_fffffffffffffec8);
  DenselySampledSpectrum::DenselySampledSpectrum(in_RCX,in_stack_fffffffffffffee0,in_RSI);
  s = in_RDI[3].m + 1;
  SpectrumHandle::SpectrumHandle
            (in_stack_fffffffffffffed0,(SpectrumHandle *)in_stack_fffffffffffffec8);
  DenselySampledSpectrum::DenselySampledSpectrum(in_RCX,(SpectrumHandle *)s,in_RSI);
  in_RDI[4].m[1][1] = local_38;
  Spectra::D(temperature,alloc_00);
  SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  SolveXYZFromSensorRGB(in_stack_000002e8,in_stack_000002e0,in_stack_000002d8);
  bVar1 = pstd::optional::operator_cast_to_bool(local_d0);
  if (!bVar1) {
    ErrorExit<>(fmt);
  }
  __src = pstd::optional<pbrt::SquareMatrix<3>_>::operator*
                    ((optional<pbrt::SquareMatrix<3>_> *)0x6e65c6);
  memcpy(in_RDI,__src,0x24);
  pstd::optional<pbrt::SquareMatrix<3>_>::~optional((optional<pbrt::SquareMatrix<3>_> *)0x6e65eb);
  DenselySampledSpectrum::~DenselySampledSpectrum((DenselySampledSpectrum *)0x6e65f8);
  return;
}

Assistant:

PixelSensor(SpectrumHandle r_bar, SpectrumHandle g_bar, SpectrumHandle b_bar,
                const RGBColorSpace *outputColorSpace, Float wbTemp, Float imagingRatio,
                Allocator alloc)
        : r_bar(r_bar, alloc),
          g_bar(g_bar, alloc),
          b_bar(b_bar, alloc),
          imagingRatio(imagingRatio) {
        // Compute XYZ from camera RGB matrix
        DenselySampledSpectrum sensorIlluminant = Spectra::D(wbTemp, alloc);
        pstd::optional<SquareMatrix<3>> m =
            SolveXYZFromSensorRGB(&sensorIlluminant, &outputColorSpace->illuminant);
        if (!m)
            ErrorExit("Sensor XYZ from RGB matrix could not be solved.");
        XYZFromSensorRGB = *m;
    }